

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

int duckdb_fmt::v6::internal::snprintf_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  long lVar1;
  char cVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  byte *pbVar7;
  byte bVar8;
  char *pcVar9;
  long lVar10;
  uint uVar11;
  byte bVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  size_t new_size;
  char *__s;
  char format [7];
  
  uVar11 = 5;
  if (-1 < precision) {
    uVar11 = precision - 1;
  }
  bVar12 = specs._4_1_;
  if (1 < bVar12) {
    uVar11 = precision;
  }
  format[0] = '%';
  uVar13 = specs._4_4_;
  if ((uVar13 >> 0x1d & 1) == 0) {
    pbVar7 = (byte *)(format + 1);
  }
  else {
    pbVar7 = (byte *)(format + 2);
    format[1] = '#';
  }
  if (-1 < (int)uVar11) {
    pbVar7[0] = 0x2e;
    pbVar7[1] = 0x2a;
    pbVar7 = pbVar7 + 2;
  }
  if (bVar12 == 3) {
    bVar8 = ((uVar13 >> 0x18 & 1) == 0) << 5 | 0x41;
  }
  else {
    bVar8 = (bVar12 == 2) + 0x65;
  }
  *pbVar7 = bVar8;
  pbVar7[1] = 0;
  sVar3 = buf->size_;
LAB_01af62c5:
  while( true ) {
    __s = buf->ptr_ + sVar3;
    uVar16 = buf->capacity_ - sVar3;
    if ((int)uVar11 < 0) {
      uVar6 = snprintf(__s,uVar16,format,value);
    }
    else {
      uVar6 = snprintf(__s,uVar16,format,value,(ulong)uVar11);
    }
    new_size = (size_t)uVar6;
    if ((int)uVar6 < 0) goto LAB_01af631f;
    if (new_size < uVar16) break;
    uVar16 = new_size + sVar3 + 1;
    if (buf->capacity_ < uVar16) goto LAB_01af632c;
  }
  if (bVar12 == 2) {
    if (precision != 0) {
      lVar14 = -0x100000000;
      uVar16 = 1;
      do {
        lVar14 = lVar14 + 0x100000000;
        lVar10 = uVar16 + (new_size - 2);
        uVar16 = uVar16 - 1;
      } while ((byte)(__s[lVar10] - 0x30U) < 10);
      memmove(__s + uVar16 + new_size + -1,__s + uVar16 + new_size,lVar14 >> 0x20);
      buffer<char>::resize(buf,(ulong)(uVar6 - 1));
      goto LAB_01af6474;
    }
  }
  else {
    if ((uVar13 & 0xff) != 3) {
      lVar10 = (new_size << 0x20) + -0x100000000;
      lVar14 = 2;
      do {
        lVar10 = lVar10 + -0x100000000;
        lVar1 = lVar14 + (new_size - 3);
        lVar14 = lVar14 + -1;
      } while (__s[lVar1] != 'e');
      lVar1 = new_size + lVar14;
      pcVar9 = __s + lVar14 + new_size + -3;
      iVar5 = (int)lVar14;
      iVar15 = 0;
      do {
        iVar15 = iVar15 * 10 + (int)__s[lVar14 + new_size] + -0x30;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0);
      iVar4 = -iVar15;
      if (__s[lVar1 + -1] != '-') {
        iVar4 = iVar15;
      }
      iVar15 = 0;
      if (lVar1 != 3) {
        iVar15 = uVar6 + iVar5 + -3;
        do {
          lVar10 = lVar10 + -0x100000000;
          iVar15 = iVar15 + -1;
          cVar2 = *pcVar9;
          pcVar9 = pcVar9 + -1;
        } while (cVar2 == '0');
        memmove(__s + 1,__s + 2,lVar10 >> 0x20);
      }
      buffer<char>::resize(buf,sVar3 + 1 + (long)iVar15);
      uVar16 = (ulong)(uint)(iVar4 - iVar15);
      goto LAB_01af6474;
    }
    new_size = sVar3 + new_size;
  }
  buffer<char>::resize(buf,new_size);
  uVar16 = 0;
LAB_01af6474:
  return (int)uVar16;
LAB_01af631f:
  if (buf->capacity_ != 0xffffffffffffffff) {
    uVar16 = buf->capacity_ + 1;
LAB_01af632c:
    (**buf->_vptr_buffer)(buf,uVar16);
  }
  goto LAB_01af62c5;
}

Assistant:

int snprintf_float(T value, int precision, float_specs specs,
                   buffer<char>& buf) {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buf.capacity() > buf.size(), "empty buffer");
  static_assert(!std::is_same<T, float>(), "");

  // Subtract 1 to account for the difference in precision since we use %e for
  // both general and exponent format.
  if (specs.format == float_format::general ||
      specs.format == float_format::exp)
    precision = (precision >= 0 ? precision : 6) - 1;

  // Build the format string.
  enum { max_format_size = 7 };  // Ths longest format is "%#.*Le".
  char format[max_format_size];
  char* format_ptr = format;
  *format_ptr++ = '%';
  if (specs.trailing_zeros) *format_ptr++ = '#';
  if (precision >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }
  if (std::is_same<T, long double>()) *format_ptr++ = 'L';
  *format_ptr++ = specs.format != float_format::hex
                      ? (specs.format == float_format::fixed ? 'f' : 'e')
                      : (specs.upper ? 'A' : 'a');
  *format_ptr = '\0';

  // Format using snprintf.
  auto offset = buf.size();
  for (;;) {
    auto begin = buf.data() + offset;
    auto capacity = buf.capacity() - offset;
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    if (precision > 100000)
      throw std::runtime_error(
          "fuzz mode - avoid large allocation inside snprintf");
#endif
    // Suppress the warning about a nonliteral format string.
    auto snprintf_ptr = FMT_SNPRINTF;
    int result = precision >= 0
                     ? snprintf_ptr(begin, capacity, format, precision, value)
                     : snprintf_ptr(begin, capacity, format, value);
    if (result < 0) {
      buf.reserve(buf.capacity() + 1);  // The buffer will grow exponentially.
      continue;
    }
    unsigned size = to_unsigned(result);
    // Size equal to capacity means that the last character was truncated.
    if (size >= capacity) {
      buf.reserve(size + offset + 1);  // Add 1 for the terminating '\0'.
      continue;
    }
    auto is_digit = [](char c) { return c >= '0' && c <= '9'; };
    if (specs.format == float_format::fixed) {
      if (precision == 0) {
        buf.resize(size);
        return 0;
      }
      // Find and remove the decimal point.
      auto end = begin + size, p = end;
      do {
        --p;
      } while (is_digit(*p));
      int fraction_size = static_cast<int>(end - p - 1);
      std::memmove(p, p + 1, fraction_size);
      buf.resize(size - 1);
      return -fraction_size;
    }
    if (specs.format == float_format::hex) {
      buf.resize(size + offset);
      return 0;
    }
    // Find and parse the exponent.
    auto end = begin + size, exp_pos = end;
    do {
      --exp_pos;
    } while (*exp_pos != 'e');
    char sign = exp_pos[1];
    assert(sign == '+' || sign == '-');
    int exp = 0;
    auto p = exp_pos + 2;  // Skip 'e' and sign.
    do {
      assert(is_digit(*p));
      exp = exp * 10 + (*p++ - '0');
    } while (p != end);
    if (sign == '-') exp = -exp;
    int fraction_size = 0;
    if (exp_pos != begin + 1) {
      // Remove trailing zeros.
      auto fraction_end = exp_pos - 1;
      while (*fraction_end == '0') --fraction_end;
      // Move the fractional part left to get rid of the decimal point.
      fraction_size = static_cast<int>(fraction_end - begin - 1);
      std::memmove(begin + 1, begin + 2, fraction_size);
    }
    buf.resize(fraction_size + offset + 1);
    return exp - fraction_size;
  }
}